

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmOutputConverter *this,string *remote,OutputFormat format
          )

{
  string_view source;
  OutputFormat format_local;
  string *remote_local;
  cmOutputConverter *this_local;
  
  source = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)remote);
  ConvertToOutputFormat_abi_cxx11_(__return_storage_ptr__,this,source,format);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputForExisting(
  const std::string& remote, OutputFormat format) const
{
#ifdef _WIN32
  // Cache the Short Paths since we only convert the same few paths anyway and
  // calling `GetShortPathNameW` is really expensive.
  static std::unordered_map<std::string, std::string> shortPathCache{};

  // If this is a windows shell, the result has a space, and the path
  // already exists, we can use a short-path to reference it without a
  // space.
  if (this->GetState()->UseWindowsShell() &&
      remote.find_first_of(" #") != std::string::npos &&
      cmSystemTools::FileExists(remote)) {

    std::string shortPath = [&]() {
      auto cachedShortPathIt = shortPathCache.find(remote);

      if (cachedShortPathIt != shortPathCache.end()) {
        return cachedShortPathIt->second;
      }

      std::string tmp{};
      cmSystemTools::GetShortPath(remote, tmp);
      shortPathCache[remote] = tmp;
      return tmp;
    }();

    return this->ConvertToOutputFormat(shortPath, format);
  }
#endif

  // Otherwise, perform standard conversion.
  return this->ConvertToOutputFormat(remote, format);
}